

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendAnd(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pObj = Gia_ManAppendObj(p);
  if (-1 < iLit0) {
    iVar1 = Abc_Lit2Var(iLit0);
    if (iVar1 < p->nObjs) {
      iVar1 = Abc_Lit2Var(iLit1);
      if (p->nObjs <= iVar1) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if (p->fGiaSimple == 0) {
        iVar1 = Abc_Lit2Var(iLit0);
        iVar2 = Abc_Lit2Var(iLit1);
        if (iVar1 == iVar2) {
          __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
      }
      iVar1 = Gia_ObjId(p,pObj);
      iVar2 = Abc_Lit2Var(iLit0);
      uVar4 = (ulong)(iVar1 - iVar2 & 0x1fffffff);
      if (iLit0 < iLit1) {
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | uVar4;
        iVar1 = Abc_LitIsCompl(iLit0);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
        iVar1 = Gia_ObjId(p,pObj);
        iVar2 = Abc_Lit2Var(iLit1);
        *(ulong *)pObj =
             *(ulong *)pObj & 0xe0000000ffffffff | (ulong)(iVar1 - iVar2 & 0x1fffffff) << 0x20;
        uVar3 = Abc_LitIsCompl(iLit1);
        uVar4 = (ulong)uVar3 << 0x3d;
        uVar5 = 0xdfffffffffffffff;
      }
      else {
        *(ulong *)pObj = *(ulong *)pObj & 0xe0000000ffffffff | uVar4 << 0x20;
        uVar3 = Abc_LitIsCompl(iLit0);
        *(ulong *)pObj = *(ulong *)pObj & 0xdfffffffffffffff | (ulong)uVar3 << 0x3d;
        iVar1 = Gia_ObjId(p,pObj);
        iVar2 = Abc_Lit2Var(iLit1);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | (ulong)(iVar1 - iVar2 & 0x1fffffff);
        iVar1 = Abc_LitIsCompl(iLit1);
        uVar4 = (ulong)(uint)(iVar1 << 0x1d);
        uVar5 = 0xffffffffdfffffff;
      }
      uVar6 = *(ulong *)pObj;
      *(ulong *)pObj = uVar5 & uVar6 | uVar4;
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pObj + -(uVar5 & uVar6 & 0x1fffffff),pObj);
        Gia_ObjAddFanout(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pObj);
      }
      if (p->fSweeper != 0) {
        uVar5 = *(ulong *)pObj & 0x1fffffff;
        uVar4 = *(ulong *)pObj >> 0x20 & 0x1fffffff;
        uVar6 = 0x4000000000000000;
        uVar7 = 0x4000000000000000;
        if (((uint)*(ulong *)(pObj + -uVar5) >> 0x1e & 1) == 0) {
          uVar7 = 0x40000000;
        }
        *(ulong *)(pObj + -uVar5) = uVar7 | *(ulong *)(pObj + -uVar5);
        uVar7 = *(ulong *)(pObj + -uVar4);
        if (((uint)uVar7 >> 0x1e & 1) == 0) {
          uVar6 = 0x40000000;
        }
        *(ulong *)(pObj + -uVar4) = uVar6 | uVar7;
        uVar4 = *(ulong *)pObj;
        *(ulong *)pObj =
             uVar4 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar4 >> 0x3d) ^ (uint)(uVar7 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pObj + -uVar5) >> 0x3f) ^
                    (uint)(uVar4 >> 0x1d) & 7)) << 0x3f;
      }
      if (p->fBuiltInSim != 0) {
        uVar4 = *(ulong *)pObj;
        *(ulong *)pObj =
             uVar4 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar4 >> 0x3d) ^
                     (uint)((ulong)*(undefined8 *)(pObj + -(uVar4 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pObj + -(uVar4 & 0x1fffffff)) >> 0x3f) ^
                    (uint)(uVar4 >> 0x1d) & 7)) << 0x3f;
        iVar1 = Gia_ObjId(p,pObj);
        Gia_ManBuiltInSimPerform(p,iVar1);
      }
      if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
        Gia_ManQuantSetSuppAnd(p,pObj);
      }
      iVar1 = Gia_ObjId(p,pObj);
      return iVar1 * 2;
    }
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
}

Assistant:

static inline int Gia_ManAppendAnd( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    if ( iLit0 < iLit1 )
    {
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    else
    {
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    if ( p->pFanData )
    {
        Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
        Gia_ObjAddFanout( p, Gia_ObjFanin1(pObj), pObj );
    }
    if ( p->fSweeper )
    {
        Gia_Obj_t * pFan0 = Gia_ObjFanin0(pObj);
        Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
        if ( pFan0->fMark0 ) pFan0->fMark1 = 1; else pFan0->fMark0 = 1;
        if ( pFan1->fMark0 ) pFan1->fMark1 = 1; else pFan1->fMark0 = 1;
        pObj->fPhase = (Gia_ObjPhase(pFan0) ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjPhase(pFan1) ^ Gia_ObjFaninC1(pObj));
    }
    if ( p->fBuiltInSim )
    {
        Gia_Obj_t * pFan0 = Gia_ObjFanin0(pObj);
        Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
        pObj->fPhase = (Gia_ObjPhase(pFan0) ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjPhase(pFan1) ^ Gia_ObjFaninC1(pObj));
        Gia_ManBuiltInSimPerform( p, Gia_ObjId( p, pObj ) );
    }
    if ( p->vSuppWords )
        Gia_ManQuantSetSuppAnd( p, pObj );
    return Gia_ObjId( p, pObj ) << 1;
}